

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nodeOverwriteCell(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell,int iCell)

{
  int iVar1;
  int in_ECX;
  i64 *in_RDX;
  long in_RSI;
  long in_RDI;
  u8 *p;
  int ii;
  u8 *local_28;
  int local_20;
  
  local_28 = (u8 *)(*(long *)(in_RSI + 0x18) +
                   (long)(int)((uint)*(byte *)(in_RDI + 0x27) * in_ECX + 4));
  iVar1 = writeInt64(local_28,*in_RDX);
  local_28 = local_28 + iVar1;
  for (local_20 = 0; local_20 < (int)(uint)*(byte *)(in_RDI + 0x25); local_20 = local_20 + 1) {
    iVar1 = writeCoord(local_28,(RtreeCoord *)((long)in_RDX + (long)local_20 * 4 + 8));
    local_28 = local_28 + iVar1;
  }
  *(undefined4 *)(in_RSI + 0x14) = 1;
  return;
}

Assistant:

static void nodeOverwriteCell(
  Rtree *pRtree,             /* The overall R-Tree */
  RtreeNode *pNode,          /* The node into which the cell is to be written */
  RtreeCell *pCell,          /* The cell to write */
  int iCell                  /* Index into pNode into which pCell is written */
){
  int ii;
  u8 *p = &pNode->zData[4 + pRtree->nBytesPerCell*iCell];
  p += writeInt64(p, pCell->iRowid);
  for(ii=0; ii<pRtree->nDim2; ii++){
    p += writeCoord(p, &pCell->aCoord[ii]);
  }
  pNode->isDirty = 1;
}